

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idaa_io.c
# Opt level: O3

int IDASetIdB(void *ida_mem,int which,N_Vector idB)

{
  int *piVar1;
  int iVar2;
  int *piVar3;
  int iVar4;
  int error_code;
  char *msgfmt;
  
  if (ida_mem == (void *)0x0) {
    msgfmt = "ida_mem = NULL illegal.";
    iVar4 = -0x14;
    ida_mem = (IDAMem)0x0;
    error_code = -0x14;
    iVar2 = 0x1a9;
  }
  else if (*(int *)((long)ida_mem + 0x848) == 0) {
    msgfmt = "Illegal attempt to call before calling IDAadjInit.";
    iVar4 = -0x65;
    error_code = -0x65;
    iVar2 = 0x1b2;
  }
  else {
    if (which < *(int *)(*(long *)((long)ida_mem + 0x840) + 0x38)) {
      piVar3 = (int *)(*(long *)((long)ida_mem + 0x840) + 0x30);
      do {
        piVar1 = *(int **)piVar3;
        piVar3 = piVar1 + 0x20;
      } while (*piVar1 != which);
      iVar2 = IDASetId(*(void **)(piVar1 + 4),idB);
      return iVar2;
    }
    msgfmt = "Illegal value for which.";
    iVar4 = -0x16;
    error_code = -0x16;
    iVar2 = 0x1bb;
  }
  IDAProcessError((IDAMem)ida_mem,error_code,iVar2,"IDASetIdB",
                  "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/idas/idaa_io.c"
                  ,msgfmt);
  return iVar4;
}

Assistant:

int IDASetIdB(void* ida_mem, int which, N_Vector idB)
{
  IDAMem IDA_mem;
  IDAadjMem IDAADJ_mem;
  IDABMem IDAB_mem;
  void* ida_memB;

  /* Is ida_mem valid? */
  if (ida_mem == NULL)
  {
    IDAProcessError(NULL, IDA_MEM_NULL, __LINE__, __func__, __FILE__,
                    MSGAM_NULL_IDAMEM);
    return IDA_MEM_NULL;
  }
  IDA_mem = (IDAMem)ida_mem;

  /* Is ASA initialized? */
  if (IDA_mem->ida_adjMallocDone == SUNFALSE)
  {
    IDAProcessError(IDA_mem, IDA_NO_ADJ, __LINE__, __func__, __FILE__,
                    MSGAM_NO_ADJ);
    return (IDA_NO_ADJ);
  }
  IDAADJ_mem = IDA_mem->ida_adj_mem;

  /* Check the value of which */
  if (which >= IDAADJ_mem->ia_nbckpbs)
  {
    IDAProcessError(IDA_mem, IDA_ILL_INPUT, __LINE__, __func__, __FILE__,
                    MSGAM_BAD_WHICH);
    return (IDA_ILL_INPUT);
  }

  /* Find the IDABMem entry in the linked list corresponding to 'which'. */
  IDAB_mem = IDAADJ_mem->IDAB_mem;
  while (IDAB_mem != NULL)
  {
    if (which == IDAB_mem->ida_index) { break; }
    /* advance */
    IDAB_mem = IDAB_mem->ida_next;
  }
  ida_memB = (void*)IDAB_mem->IDA_mem;

  return IDASetId(ida_memB, idB);
}